

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int compareFiles(char *r1,char *r2)

{
  char cVar1;
  int __fd;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  ssize_t sVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char bytes1 [4096];
  char bytes2 [4096];
  undefined1 auStack_2038 [4096];
  undefined1 local_1038 [4104];
  
  cVar1 = update_results;
  __fd = open64(r1,0);
  if (cVar1 == '\x01') {
    iVar3 = -1;
    if (__fd < 0) {
      return -1;
    }
    iVar8 = 0;
    iVar2 = open64(r2,0x241,0x1a4);
    if (-1 < iVar2) {
      do {
        sVar4 = read(__fd,auStack_2038,0x1000);
        uVar6 = (uint)sVar4;
        if ((int)uVar6 < 1) goto LAB_0010c6ff;
        sVar4 = write(iVar2,auStack_2038,(ulong)(uVar6 & 0x7fffffff));
        iVar8 = iVar8 + uVar6;
      } while ((uint)sVar4 == uVar6);
      iVar8 = 1;
LAB_0010c6ff:
      close(iVar2);
      close(__fd);
      if (iVar8 == 0) {
        unlink(r2);
      }
      return (uint)(uVar6 != 0);
    }
  }
  else {
    if (__fd < 0) {
      return -1;
    }
    iVar2 = open64(r2,0);
    do {
      sVar4 = read(__fd,auStack_2038,0x1000);
      uVar6 = 0;
      if (-1 < iVar2) {
        sVar5 = read(iVar2,local_1038,0x1000);
        uVar6 = (uint)sVar5;
      }
      uVar7 = (uint)sVar4;
      if (((int)uVar7 < 0) || (uVar6 != uVar7)) break;
      if (uVar7 == 0) {
        close(__fd);
        iVar3 = 0;
        goto LAB_0010c7bd;
      }
      iVar3 = bcmp(auStack_2038,local_1038,(ulong)(uVar7 & 0x7fffffff));
    } while (iVar3 == 0);
    close(__fd);
    iVar3 = 1;
LAB_0010c7bd:
    __fd = iVar2;
    if (iVar2 < 0) {
      return iVar3;
    }
  }
  close(__fd);
  return iVar3;
}

Assistant:

static int compareFiles(const char *r1 /* temp */, const char *r2 /* result */) {
    int res1, res2, total;
    int fd1, fd2;
    char bytes1[4096];
    char bytes2[4096];

    if (update_results) {
        fd1 = open(r1, RD_FLAGS);
        if (fd1 < 0)
            return(-1);
        fd2 = open(r2, WR_FLAGS, 0644);
        if (fd2 < 0) {
            close(fd1);
            return(-1);
        }
        total = 0;
        do {
            res1 = read(fd1, bytes1, 4096);
            if (res1 <= 0)
                break;
            total += res1;
            res2 = write(fd2, bytes1, res1);
            if (res2 <= 0 || res2 != res1)
                break;
        } while (1);
        close(fd2);
        close(fd1);
        if (total == 0)
            unlink(r2);
        return(res1 != 0);
    }

    fd1 = open(r1, RD_FLAGS);
    if (fd1 < 0)
        return(-1);
    fd2 = open(r2, RD_FLAGS);
    while (1) {
        res1 = read(fd1, bytes1, 4096);
        res2 = fd2 >= 0 ? read(fd2, bytes2, 4096) : 0;
	if ((res1 != res2) || (res1 < 0)) {
	    close(fd1);
            if (fd2 >= 0)
                close(fd2);
	    return(1);
	}
	if (res1 == 0)
	    break;
	if (memcmp(bytes1, bytes2, res1) != 0) {
	    close(fd1);
            if (fd2 >= 0)
                close(fd2);
	    return(1);
	}
    }
    close(fd1);
    if (fd2 >= 0)
        close(fd2);
    return(0);
}